

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimeline.cpp
# Opt level: O2

void __thiscall QTimeLine::setPaused(QTimeLine *this,bool paused)

{
  State SVar1;
  QTimeLinePrivate *this_00;
  parameter_type pVar2;
  duration<long,_std::ratio<1L,_1000L>_> dVar3;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTimeLinePrivate *)(this->super_QObject).d_ptr.d;
  SVar1 = this_00->state;
  if (SVar1 == NotRunning) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context.line = 0;
    local_40.context.file._0_4_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QTimeLine::setPaused: Not running");
  }
  else {
    if (paused && SVar1 != Paused) {
      pVar2 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
              ::value(&this_00->currentTime);
      this_00->startTime = pVar2;
      QBasicTimer::stop(&this_00->basicTimer);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QTimeLinePrivate::setState(this_00,Paused);
        return;
      }
      goto LAB_003a0b16;
    }
    if (SVar1 == Paused && !paused) {
      local_40.context.version = 1;
      local_40.context.line = 0;
      dVar3 = std::chrono::
              operator*<long,_std::ratio<1L,_1000L>,_QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>_>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40,
                         &this_00->updateInterval);
      QBasicTimer::start(&this_00->basicTimer,(Duration)(dVar3.__r * 1000000),&this->super_QObject);
      pVar2 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
              ::value(&this_00->currentTime);
      this_00->startTime = pVar2;
      QElapsedTimer::start(&this_00->timer);
      QTimeLinePrivate::setState(this_00,Running);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_003a0b16:
  __stack_chk_fail();
}

Assistant:

void QTimeLine::setPaused(bool paused)
{
    Q_D(QTimeLine);
    if (d->state == NotRunning) {
        qWarning("QTimeLine::setPaused: Not running");
        return;
    }
    if (paused && d->state != Paused) {
        d->startTime = d->currentTime;
        d->basicTimer.stop();
        d->setState(Paused);
    } else if (!paused && d->state == Paused) {
        // Same as resume()
        d->basicTimer.start(d->updateInterval * 1ms, this);
        d->startTime = d->currentTime;
        d->timer.start();
        d->setState(Running);
    }
}